

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_swap(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 arg1;
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  TCGv_i32 reg;
  TCGv_i32 src2;
  TCGv_i32 src1;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx_00);
  ret_00 = tcg_temp_new_i32(tcg_ctx_00);
  arg1 = tcg_ctx_00->cpu_dregs[(int)(insn & 7)];
  tcg_gen_shli_i32_m68k(tcg_ctx_00,ret,arg1,0x10);
  tcg_gen_shri_i32_m68k(tcg_ctx_00,ret_00,arg1,0x10);
  tcg_gen_or_i32(tcg_ctx_00,arg1,ret,ret_00);
  tcg_temp_free_i32(tcg_ctx_00,ret_00);
  tcg_temp_free_i32(tcg_ctx_00,ret);
  gen_logic_cc(s,arg1,2);
  return;
}

Assistant:

DISAS_INSN(swap)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src1;
    TCGv src2;
    TCGv reg;

    src1 = tcg_temp_new(tcg_ctx);
    src2 = tcg_temp_new(tcg_ctx);
    reg = DREG(insn, 0);
    tcg_gen_shli_i32(tcg_ctx, src1, reg, 16);
    tcg_gen_shri_i32(tcg_ctx, src2, reg, 16);
    tcg_gen_or_i32(tcg_ctx, reg, src1, src2);
    tcg_temp_free(tcg_ctx, src2);
    tcg_temp_free(tcg_ctx, src1);
    gen_logic_cc(s, reg, OS_LONG);
}